

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

istream * __thiscall nivalis::Environment::from_bin(Environment *this,istream *is)

{
  pointer pdVar1;
  pointer pUVar2;
  ulong __new_size;
  size_t i;
  ulong uVar3;
  size_t i_1;
  long lVar4;
  
  util::resize_from_read_bin<std::vector<double,std::allocator<double>>>(is,&this->vars);
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    pdVar1 = (this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    __new_size = (long)(this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
    if (__new_size <= uVar3) break;
    util::read_bin<double>(is,(double *)((long)pdVar1 + lVar4));
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 8;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->varname,__new_size);
  util::
  resize_from_read_bin<std::vector<nivalis::Environment::UserFunction,std::allocator<nivalis::Environment::UserFunction>>>
            (is,&this->funcs);
  lVar4 = 0x50;
  for (uVar3 = 0;
      pUVar2 = (this->funcs).
               super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->funcs).
                             super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) / 0x58);
      uVar3 = uVar3 + 1) {
    Expr::from_bin((Expr *)((long)pUVar2 + lVar4 + -0x30),is);
    util::read_bin<unsigned_long>
              (is,(unsigned_long *)
                  ((long)&(((this->funcs).
                            super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                            ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                  lVar4));
    lVar4 = lVar4 + 0x58;
  }
  return is;
}

Assistant:

std::istream& Environment::from_bin(std::istream& is) {
    util::resize_from_read_bin(is, vars);
    for (size_t i = 0; i < vars.size(); ++i) {
        util::read_bin(is, vars[i]);
    }
    varname.resize(vars.size());
    util::resize_from_read_bin(is, funcs);
    for (size_t i = 0; i < funcs.size(); ++i) {
        funcs[i].expr.from_bin(is);
        util::read_bin(is, funcs[i].n_args);
    }
    return is;
}